

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.hpp
# Opt level: O3

void __thiscall helics::Filter::~Filter(Filter *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR__Filter_004bb6a0;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (this->filtOp).super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR__Interface_004b9f88;
  pcVar1 = (this->super_Interface).mName._M_dataplus._M_p;
  paVar2 = &(this->super_Interface).mName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Filter(Filter&& filt) = default;